

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O3

void msd_D_adaptive<vector_bagwell<unsigned_char*,16u>>
               (uchar **strings,size_t n,size_t depth,vector_bagwell<unsigned_char_*,_16U> *buckets)

{
  uchar *puVar1;
  long lVar2;
  size_t n_00;
  size_t j;
  long *__ptr;
  long lVar3;
  pointer pppuVar4;
  ushort uVar5;
  long lVar6;
  pointer pppuVar7;
  vector_bagwell<unsigned_char_*,_16U> *pvVar8;
  size_t __n;
  size_t j_1;
  uint i_1;
  uchar **t;
  uchar **ppuVar9;
  long lVar10;
  uint i_2;
  ulong uVar11;
  uint16_t cache [16];
  long local_80;
  ushort auStack_58 [20];
  
  if (n < 0x10000) {
    msd_D<vector_bagwell<unsigned_char*,16u>,unsigned_short>(strings,n,depth,buckets);
    return;
  }
  __ptr = (long *)malloc(0x80000);
  if ((n & 0xfffffffffffffff0) == 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    ppuVar9 = strings;
    do {
      lVar3 = 0;
      do {
        puVar1 = ppuVar9[lVar3];
        if (puVar1 == (uchar *)0x0) goto LAB_001a30dc;
        if (puVar1[depth] == '\0') {
          uVar5 = 0;
        }
        else {
          uVar5 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
        }
        auStack_58[lVar3] = uVar5;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x10);
      lVar3 = 0;
      t = ppuVar9;
      do {
        vector_bagwell<unsigned_char_*,_16U>::push_back(buckets + auStack_58[lVar3],t);
        lVar3 = lVar3 + 1;
        t = t + 1;
      } while (lVar3 != 0x10);
      uVar11 = uVar11 + 0x10;
      ppuVar9 = ppuVar9 + 0x10;
    } while (uVar11 < (n & 0xfffffffffffffff0));
  }
  local_80 = n - uVar11;
  if (uVar11 <= n && local_80 != 0) {
    ppuVar9 = strings + uVar11;
    do {
      puVar1 = *ppuVar9;
      if (puVar1 == (uchar *)0x0) {
LAB_001a30dc:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar1[depth] == '\0') {
        uVar11 = 0;
      }
      else {
        uVar11 = (ulong)CONCAT11(puVar1[depth],puVar1[depth + 1]);
      }
      vector_bagwell<unsigned_char_*,_16U>::push_back(buckets + uVar11,ppuVar9);
      ppuVar9 = ppuVar9 + 1;
      local_80 = local_80 + -1;
    } while (local_80 != 0);
  }
  lVar3 = 0;
  pvVar8 = buckets;
  do {
    if (pvVar8->_insertpos == (uchar **)0x0) {
      lVar6 = 0;
    }
    else {
      pppuVar4 = (pvVar8->_index_block).
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      lVar6 = (long)pvVar8->_insertpos +
              ((long)((1 << ((char)((uint)((int)pppuVar4 -
                                          *(int *)&(pvVar8->_index_block).
                                                                                                      
                                                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                             3U & 0x1f)) + -0x10) * 8 - (long)pppuVar4[-1]) >> 3;
    }
    __ptr[lVar3] = lVar6;
    lVar3 = lVar3 + 1;
    pvVar8 = pvVar8 + 1;
  } while (lVar3 != 0x10000);
  lVar6 = 0;
  lVar3 = 0;
  do {
    lVar2 = __ptr[lVar6];
    if (lVar2 != 0) {
      pvVar8 = buckets + lVar6;
      ppuVar9 = strings + lVar3;
      pppuVar7 = (pvVar8->_index_block).
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pppuVar4 = (pvVar8->_index_block).
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (8 < (ulong)((long)pppuVar4 - (long)pppuVar7)) {
        lVar10 = 0x10;
        uVar11 = 1;
        do {
          if (lVar10 != 0) {
            memmove(ppuVar9,pppuVar7[uVar11 - 1],lVar10 * 8);
            pppuVar7 = (pvVar8->_index_block).
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            pppuVar4 = (pvVar8->_index_block).
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
          }
          ppuVar9 = ppuVar9 + lVar10;
          lVar10 = lVar10 * 2;
          uVar11 = uVar11 + 1;
        } while (uVar11 < (ulong)((long)pppuVar4 - (long)pppuVar7 >> 3));
      }
      __n = (long)pvVar8->_insertpos - (long)pppuVar4[-1];
      if (__n != 0) {
        memmove(ppuVar9,pppuVar4[-1],__n);
      }
      lVar3 = lVar3 + lVar2;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x10000);
  lVar3 = 0;
  do {
    vector_bagwell<unsigned_char_*,_16U>::clear
              ((vector_bagwell<unsigned_char_*,_16U> *)
               ((long)&(buckets->_index_block).
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0x280000);
  lVar3 = *__ptr;
  lVar6 = 1;
  do {
    n_00 = __ptr[lVar6];
    if (n_00 != 0) {
      if ((char)lVar6 != '\0') {
        msd_D_adaptive<vector_bagwell<unsigned_char*,16u>>(strings + lVar3,n_00,depth + 2,buckets);
      }
      lVar3 = lVar3 + n_00;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x10000);
  free(__ptr);
  return;
}

Assistant:

static void
msd_D_adaptive(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 0x10000) {
		msd_D<Bucket, uint16_t>(strings, n, depth, buckets);
		return;
	}
	size_t* bucketsize = (size_t*) malloc(0x10000 * sizeof(size_t));
	size_t i=0;
	for (; i < n-n%16; i+=16) {
		uint16_t cache[16];
		for (size_t j=0; j < 16; ++j) {
			cache[j] = get_char<uint16_t>(strings[i+j], depth);
		}
		for (size_t j=0; j < 16; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		const uint16_t ch = get_char<uint16_t>(strings[i], depth);
		buckets[ch].push_back(strings[i]);
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_D_adaptive(
				strings+pos, bucketsize[i],
				depth+2, buckets);
		pos += bucketsize[i];
	}
	free(bucketsize);
}